

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O0

bool __thiscall
directed_flag_complex_in_memory_computer::
coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::has_next(coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this)

{
  _Self *in_RDI;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar1;
  _Self *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffc0;
  compressed_sparse_matrix<entry_t> *in_stack_ffffffffffffffc8;
  
  uVar1 = false;
  if (*(int *)&in_RDI->_M_node != -1) {
    compressed_sparse_matrix<entry_t>::cbegin(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::operator+(in_stack_ffffffffffffff98,CONCAT17(uVar1,in_stack_ffffffffffffff90));
    compressed_sparse_matrix<entry_t>::cend(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    uVar1 = std::operator!=((_Self *)CONCAT17(uVar1,in_stack_ffffffffffffff90),in_RDI);
  }
  return (bool)uVar1;
}

Assistant:

bool has_next() { return index != -1 && matrix.cbegin(index) + current_offset != matrix.cend(index); }